

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToFirst(DBIter *this)

{
  long lVar1;
  uint uVar2;
  DBIter *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  DBIter *in_stack_00000018;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->direction_ = kForward;
  ClearSavedValue(in_RDI);
  (*in_RDI->iter_->_vptr_Iterator[3])();
  uVar2 = (*in_RDI->iter_->_vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    in_RDI->valid_ = false;
  }
  else {
    FindNextUserEntry(in_stack_00000018,in_stack_00000017,(string *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::SeekToFirst() {
  direction_ = kForward;
  ClearSavedValue();
  iter_->SeekToFirst();
  if (iter_->Valid()) {
    FindNextUserEntry(false, &saved_key_ /* temporary storage */);
  } else {
    valid_ = false;
  }
}